

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lvalue.cpp
# Opt level: O1

void __thiscall
iu_StringSplitLvalue_x_iutest_x_chain_at_first_back_by_stl_str_Test<wchar_t>::Body
          (iu_StringSplitLvalue_x_iutest_x_chain_at_first_back_by_stl_str_Test<wchar_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_R9;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> s;
  AssertionResult iutest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> re;
  allocator<char> local_269;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_268;
  AssertionHelper local_248;
  AssertionResult local_218;
  long *local_1f0 [2];
  long local_1e0 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1d0;
  undefined1 local_1b0 [128];
  ios_base local_130 [264];
  
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_268,L"arikitari na_world!",L"");
  local_1f0[0] = local_1e0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1f0,L"_ ",L"");
  std::__cxx11::wstring::wstring((wstring *)&local_248,(wstring *)local_1f0);
  ::detail::
  split_helper<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
  ::operator>><detail::split_at_first_back,_nullptr>
            ((split_helper_subroutine<detail::split_at_first_back,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t>
              *)local_1b0,
             (split_helper<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
              *)&local_248);
  ::detail::
  operator|<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t,_nullptr>
            (&local_1d0,&local_268,
             (split_helper_subroutine<detail::split_at_first_back,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t>
              *)local_1b0);
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ * 4 + 4);
  }
  paVar1 = &local_248.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_248.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity * 4 + 4);
  }
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0],local_1e0[0] * 4 + 4);
  }
  local_1b0._0_8_ = L"na_world!";
  iutest::internal::CmpHelperEQ<wchar_t_const*,std::__cxx11::wstring>
            (&local_218,(internal *)"constant::na_world<char_type>()","re",local_1b0,
             (wchar_t **)&local_1d0,in_R9);
  if (local_218.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,local_218.m_message._M_dataplus._M_p,&local_269);
    local_248.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
    ;
    local_248.m_part_result.super_iuCodeMessage.m_line = 0x66;
    local_248.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_248,(Fixed *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_248.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != &local_218.m_message.field_2) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    local_218.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringSplitLvalue, chain_at_last_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}